

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O0

void __thiscall r_exec::Fact::~Fact(Fact *this)

{
  Fact *this_local;
  
  ~Fact(this);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT Fact:
    public _Fact
{
public:
    void *operator new(size_t s);
    Fact();
    Fact(r_code::SysObject *source);
    Fact(Fact *f);
    Fact(Code *object, uint64_t after, uint64_t before, double confidence, double psln_thr);
}